

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

PackageImportDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PackageImportDeclarationSyntax,slang::syntax::PackageImportDeclarationSyntax_const&>
          (BumpAllocator *this,PackageImportDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  PackageImportDeclarationSyntax *pPVar8;
  
  pPVar8 = (PackageImportDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8)
  ;
  if ((PackageImportDeclarationSyntax *)this->endPtr < pPVar8 + 1) {
    pPVar8 = (PackageImportDeclarationSyntax *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(pPVar8 + 1);
  }
  (pPVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pPVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pPVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pPVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pPVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pPVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pPVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pPVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pPVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (pPVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pPVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pPVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pPVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d2a10;
  uVar5 = (args->keyword).field_0x2;
  NVar6.raw = (args->keyword).numFlags.raw;
  uVar7 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  (pPVar8->keyword).kind = (args->keyword).kind;
  (pPVar8->keyword).field_0x2 = uVar5;
  (pPVar8->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pPVar8->keyword).rawLen = uVar7;
  (pPVar8->keyword).info = pIVar3;
  uVar4 = *(undefined4 *)&(args->items).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->items).super_SyntaxListBase.super_SyntaxNode.parent;
  (pPVar8->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->items).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pPVar8->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pPVar8->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pPVar8->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->items).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pPVar8->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (pPVar8->items).super_SyntaxListBase.childCount = (args->items).super_SyntaxListBase.childCount;
  (pPVar8->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d6340;
  sVar2 = (args->items).elements._M_extent._M_extent_value;
  (pPVar8->items).elements._M_ptr = (args->items).elements._M_ptr;
  (pPVar8->items).elements._M_extent._M_extent_value = sVar2;
  uVar5 = (args->semi).field_0x2;
  NVar6.raw = (args->semi).numFlags.raw;
  uVar7 = (args->semi).rawLen;
  pIVar3 = (args->semi).info;
  (pPVar8->semi).kind = (args->semi).kind;
  (pPVar8->semi).field_0x2 = uVar5;
  (pPVar8->semi).numFlags = (NumericTokenFlags)NVar6.raw;
  (pPVar8->semi).rawLen = uVar7;
  (pPVar8->semi).info = pIVar3;
  return pPVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }